

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_Z_upper.c
# Opt level: O0

void test_option_Z_upper(void)

{
  char *pcVar1;
  ulong local_20;
  size_t s;
  char *pcStack_10;
  int r;
  char *p;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_Z_upper.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  s._4_4_ = systemf("echo f | %s -oZ >archive.out 2>archive.err",testprog);
  pcStack_10 = slurpfile(&local_20,"archive.err");
  pcStack_10[local_20] = '\0';
  if (s._4_4_ == L'\0') {
    free(pcStack_10);
    pcStack_10 = slurpfile(&local_20,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_Z_upper.c"
                     ,L'&',(uint)(2 < local_20),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_Z_upper.c"
                        ,L'\'',pcStack_10,"p",anon_var_dwarf_7e6d,"\"\\x1f\\x9d\"",2,"2",(void *)0x0
                       );
    free(pcStack_10);
  }
  else {
    pcVar1 = strstr(pcStack_10,"compression not available");
    if (pcVar1 == (char *)0x0) {
      failure("-Z option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_Z_upper.c"
                          ,L'\x1f',(long)s._4_4_,"r",0,"0",(void *)0x0);
      free(pcStack_10);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_Z_upper.c"
                     ,L'\x19');
      test_skipping("This version of bsdcpio was compiled without compress support");
      free(pcStack_10);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_Z_upper)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with compress compression. */
	r = systemf("echo f | %s -oZ >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "compression not available") != NULL) {
			skipping("This version of bsdcpio was compiled "
			    "without compress support");
			free(p);
			return;
		}
		failure("-Z option is broken");
		assertEqualInt(r, 0);
		free(p);
		return;
	}
	free(p);
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x1f\x9d", 2);
	free(p);
}